

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

void __thiscall
chaiscript::parser::ChaiScript_Parser::
Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
process_hex(Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  undefined8 uVar3;
  char *local_30;
  
  __nptr = (this->hex_matches)._M_dataplus._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  strtoll(__nptr,&local_30,0x10);
  if (local_30 == __nptr) {
    uVar3 = std::__throw_invalid_argument("stoll");
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    _Unwind_Resume(uVar3);
  }
  if (*piVar2 != 0) {
    if (*piVar2 != 0x22) goto LAB_00197b19;
    std::__throw_out_of_range("stoll");
  }
  *piVar2 = iVar1;
LAB_00197b19:
  std::__cxx11::string::push_back((char)this->match);
  (this->hex_matches)._M_string_length = 0;
  *(this->hex_matches)._M_dataplus._M_p = '\0';
  this->is_escaped = false;
  this->is_hex = false;
  return;
}

Assistant:

void process_hex()
        {
          auto val = stoll(hex_matches, 0, 16);
          match.push_back(char_type(val));
          hex_matches.clear();
          is_escaped = false;
          is_hex = false;
        }